

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_constructor
                  (JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int classid)

{
  byte bVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  JSValue val;
  JSValue val_00;
  int iVar5;
  uint uVar6;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  JSValueUnion JVar11;
  JSValueUnion JVar12;
  char *fmt;
  JSRuntime *rt;
  int64_t iVar13;
  int64_t iVar14;
  JSRefCountHeader *p_3;
  bool bVar15;
  JSValue obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue v;
  JSValue obj_03;
  JSValue this_obj;
  JSValue JVar16;
  JSValue JVar17;
  JSValue JVar18;
  JSValue JVar19;
  JSValue buffer;
  JSValue buffer_00;
  JSValue prop;
  JSValue prop_00;
  JSValue buffer_01;
  JSValue prop_01;
  JSValue prop_02;
  JSValue obj_04;
  JSValue obj_05;
  JSValue val_01;
  JSValue this_obj_00;
  uint64_t in_stack_ffffffffffffff88;
  JSRefCountHeader *p_1;
  ulong local_60;
  JSRefCountHeader *p;
  int *local_50;
  undefined8 local_48;
  JSValueUnion local_40;
  ulong local_38;
  JSValueUnion JVar7;
  
  bVar1 = "includes"[(long)classid + 1];
  iVar13 = argv->tag;
  if ((int)iVar13 != -1) {
    JVar16.tag = iVar13;
    JVar16.u.ptr = (argv->u).ptr;
    iVar5 = JS_ToIndex(ctx,&local_48,JVar16);
    if (iVar5 == 0) {
      p_1 = (JSRefCountHeader *)CONCAT44(local_48._4_4_,(uint)local_48);
      JVar16 = js_array_buffer_constructor3
                         (ctx,(JSValue)(ZEXT816(3) << 0x40),(long)p_1 << (bVar1 & 0x3f),0x13,
                          (uint8_t *)0x0,js_array_buffer_free,(void *)0x0,1);
      JVar17 = (JSValue)(ZEXT816(6) << 0x40);
      uVar10 = 0;
      if ((int)JVar16.tag == 6) goto LAB_00131bde;
      local_60 = 0;
LAB_001315ac:
      p = (JSRefCountHeader *)JVar16.u;
      JVar17 = js_create_from_ctor(ctx,new_target,classid);
      JVar7 = JVar17.u;
      if ((uint)JVar17.tag == 6) {
        if ((0xfffffff4 < (uint)JVar16.tag) &&
           (iVar5 = p->ref_count, p->ref_count = iVar5 + -1, iVar5 < 2)) {
          rt = ctx->rt;
          JVar17 = JVar16;
LAB_00131714:
          __JS_FreeValueRT(rt,JVar17);
        }
      }
      else {
        obj_00.tag = (int64_t)p;
        obj_00.u.ptr = JVar7.ptr;
        buffer.tag = local_60;
        buffer.u = (JSValueUnion)(JSValueUnion)JVar16.tag;
        iVar5 = typed_array_init(ctx,obj_00,buffer,(uint64_t)p_1,in_stack_ffffffffffffff88);
        if (iVar5 == 0) {
          uVar10 = (ulong)JVar7.ptr & 0xffffffff00000000;
          goto LAB_00131bde;
        }
        if ((0xfffffff4 < (uint)JVar17.tag) &&
           (iVar5 = *JVar7.ptr, *(int *)JVar7.ptr = iVar5 + -1, iVar5 < 2)) {
          rt = ctx->rt;
          goto LAB_00131714;
        }
      }
    }
    goto LAB_001314ef;
  }
  JVar7 = (JSValueUnion)(argv->u).ptr;
  JVar18.tag = iVar13;
  JVar18.u.ptr = JVar7.ptr;
  if (1 < (ushort)(*(short *)((long)JVar7.ptr + 6) - 0x13U)) {
    if ((ushort)(*(short *)((long)JVar7.ptr + 6) - 0x15U) < 9) {
      JVar16 = js_create_from_ctor(ctx,new_target,classid);
      if ((int)JVar16.tag != 6) {
        lVar3 = *(long *)((long)JVar7.ptr + 0x30);
        JVar12 = (JSValueUnion)((JSValueUnion *)(lVar3 + 0x18))->ptr;
        lVar4 = *(long *)((long)JVar12.ptr + 0x30);
        if (*(char *)(lVar4 + 4) == '\0') {
          pvVar8 = (void *)(ulong)*(uint *)((long)JVar7.ptr + 0x40);
          if (*(char *)(lVar4 + 5) == '\0') {
            obj_02.tag = -1;
            obj_02.u.ptr = JVar12.ptr;
            JVar17 = JS_SpeciesConstructor(ctx,obj_02,(JSValue)(ZEXT816(3) << 0x40));
            v.tag = JVar17.tag;
            if ((uint)JVar17.tag == 6) goto LAB_00131ba8;
            local_40 = JVar17.u;
            JVar18 = js_array_buffer_constructor3
                               (ctx,JVar17,(long)pvVar8 << (bVar1 & 0x3f),0x13,(uint8_t *)0x0,
                                js_array_buffer_free,(void *)0x0,1);
            if ((0xfffffff4 < (uint)JVar17.tag) &&
               (iVar5 = *local_40.ptr, *(int *)local_40.ptr = iVar5 + -1, iVar5 < 2)) {
              v.u.ptr = local_40.ptr;
              __JS_FreeValueRT(ctx->rt,v);
            }
          }
          else {
            JVar18 = js_array_buffer_constructor3
                               (ctx,(JSValue)(ZEXT816(3) << 0x40),(long)pvVar8 << (bVar1 & 0x3f),
                                0x13,(uint8_t *)0x0,js_array_buffer_free,(void *)0x0,1);
          }
          JVar12 = JVar18.u;
          if ((JVar18.tag & 0xffffffffU) != 6) {
            if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar7.ptr + 0x30) + 0x18) + 0x30) + 4)
                != '\0') {
              if ((0xfffffff4 < (uint)JVar18.tag) &&
                 (iVar5 = *JVar12.ptr, *(int *)JVar12.ptr = iVar5 + -1, iVar5 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar18);
              }
              goto LAB_001316a4;
            }
            if ((uint)JVar18.tag == 0xffffffff) {
              if (*(short *)((long)JVar12.ptr + 6) == 0x13) {
                local_50 = *(int **)((long)JVar12.ptr + 0x30);
              }
              else {
                local_50 = (int *)0x0;
              }
            }
            else {
              local_50 = (int *)0x0;
            }
            obj_03.tag = (int64_t)JVar12.ptr;
            obj_03.u.ptr = JVar16.u.ptr;
            buffer_01.tag = 0;
            buffer_01.u.ptr = (void *)JVar18.tag;
            iVar5 = typed_array_init(ctx,obj_03,buffer_01,(uint64_t)pvVar8,in_stack_ffffffffffffff88
                                    );
            if (iVar5 == 0) {
              if ((uint)*(ushort *)((long)JVar7.ptr + 6) == classid) {
                memcpy(*(void **)(local_50 + 2),
                       (void *)((ulong)*(uint *)(lVar3 + 0x20) + *(long *)(lVar4 + 8)),
                       (long)*local_50);
              }
              else if (pvVar8 != (void *)0x0) {
                JVar12.float64 = 0.0;
                do {
                  bVar15 = -1 < JVar12.int32;
                  JVar11.float64 = (double)((ulong)JVar12.ptr & 0xffffffff);
                  if (bVar15) {
                    JVar11 = JVar12;
                  }
                  iVar14 = 7;
                  if (bVar15) {
                    iVar14 = 0;
                  }
                  this_obj.tag = iVar13;
                  this_obj.u.ptr = JVar7.ptr;
                  prop_01.tag = iVar14;
                  prop_01.u.float64 = JVar11.float64;
                  JVar17 = JS_GetPropertyValue(ctx,this_obj,prop_01);
                  if (((int)JVar17.tag == 6) ||
                     (val_00.tag = 0x4000, val_00.u = (JSValueUnion)(JSValueUnion)JVar17.tag,
                     prop_02.tag = iVar14, prop_02.u.float64 = JVar11.float64,
                     iVar5 = JS_SetPropertyValue(ctx,JVar16,prop_02,val_00,JVar17.u._0_4_),
                     iVar5 < 0)) goto LAB_00131ba8;
                  JVar12.float64 = JVar12.float64 + 1;
                } while (pvVar8 != JVar12.ptr);
              }
              goto LAB_00131caf;
            }
          }
        }
        else {
LAB_001316a4:
          JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
        }
        goto LAB_00131ba8;
      }
      uVar10 = (ulong)JVar16.u.ptr & 0xffffffff00000000;
    }
    else {
      JVar16 = js_create_from_ctor(ctx,new_target,classid);
      if ((int)JVar16.tag != 6) {
        obj.tag = iVar13;
        obj.u.ptr = JVar7.ptr;
        this_obj_00.tag = iVar13;
        this_obj_00.u.ptr = JVar7.ptr;
        JVar17 = JS_GetPropertyInternal(ctx,obj,0xc6,this_obj_00,0);
        uVar6 = (uint)JVar17.tag;
        if (uVar6 - 2 < 2) {
          obj_04.tag = iVar13;
          obj_04.u.ptr = JVar7.ptr;
          iVar5 = js_get_length64(ctx,&local_48,obj_04);
          if (iVar5 == 0) {
            *(int *)JVar7.ptr = *JVar7.ptr + 1;
            pvVar8 = (void *)CONCAT44(local_48._4_4_,(uint)local_48);
LAB_001317dc:
            p_1 = (JSRefCountHeader *)JVar18.u;
            JVar17 = js_array_buffer_constructor3
                               (ctx,(JSValue)(ZEXT816(3) << 0x40),(long)pvVar8 << (bVar1 & 0x3f),
                                0x13,(uint8_t *)0x0,js_array_buffer_free,(void *)0x0,1);
            if (((int)JVar17.tag != 6) &&
               (obj_01.tag = (int64_t)JVar17.u.ptr, obj_01.u.float64 = JVar16.u.float64,
               buffer_00.tag = 0, buffer_00.u = (JSValueUnion)JVar17.tag,
               iVar5 = typed_array_init(ctx,obj_01,buffer_00,(uint64_t)pvVar8,
                                        in_stack_ffffffffffffff88), iVar5 == 0)) {
              if (0 < (long)pvVar8) {
                uVar6 = 1;
                JVar7.float64 = 0.0;
                do {
                  uVar9 = uVar6 - 1;
                  JVar12.float64 = (double)uVar9;
                  if (-1 < (int)uVar9) {
                    JVar12 = JVar7;
                  }
                  iVar13 = 7;
                  if (-1 < (int)uVar9) {
                    iVar13 = 0;
                  }
                  prop.tag = iVar13;
                  prop.u.float64 = JVar12.float64;
                  JVar17 = JS_GetPropertyValue(ctx,JVar18,prop);
                  if (((int)JVar17.tag == 6) ||
                     (val.tag = 0x4000, val.u = (JSValueUnion)(JSValueUnion)JVar17.tag,
                     prop_00.tag = iVar13, prop_00.u.float64 = JVar12.float64,
                     iVar5 = JS_SetPropertyValue(ctx,JVar16,prop_00,val,JVar17.u._0_4_), iVar5 < 0))
                  goto LAB_00131843;
                  JVar7._4_4_ = 0;
                  JVar7.int32 = uVar6;
                  uVar6 = uVar6 + 1;
                } while (JVar7.ptr < pvVar8);
              }
              if ((0xfffffff4 < (uint)JVar18.tag) &&
                 (iVar5 = p_1->ref_count, p_1->ref_count = iVar5 + -1, iVar5 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar18);
              }
LAB_00131caf:
              uVar10 = (ulong)JVar16.u.ptr & 0xffffffff00000000;
              goto LAB_00131bdb;
            }
LAB_00131843:
            if ((0xfffffff4 < (uint)JVar18.tag) &&
               (iVar5 = *JVar18.u.ptr, *(int *)JVar18.u.ptr = iVar5 + -1, iVar5 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar18);
            }
          }
        }
        else if (uVar6 != 6) {
          obj_05.tag = iVar13;
          obj_05.u.ptr = JVar7.ptr;
          JVar18 = js_array_from_iterator(ctx,(uint32_t *)&local_48,obj_05,JVar17);
          if ((0xfffffff4 < uVar6) &&
             (iVar5 = *JVar17.u.ptr, *(int *)JVar17.u.ptr = iVar5 + -1, iVar5 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar17);
          }
          if ((int)JVar18.tag != 6) {
            pvVar8 = (void *)(ulong)(uint)local_48;
            goto LAB_001317dc;
          }
          goto LAB_00131843;
        }
LAB_00131ba8:
        if ((0xfffffff4 < (uint)JVar16.tag) &&
           (iVar5 = *JVar16.u.ptr, *(int *)JVar16.u.ptr = iVar5 + -1, iVar5 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar16);
        }
      }
      uVar10 = 0;
      JVar16 = (JSValue)(ZEXT816(6) << 0x40);
    }
LAB_00131bdb:
    JVar17.tag = JVar16.tag;
    JVar17.u.float64 = JVar16.u.float64 | uVar10;
    goto LAB_00131bde;
  }
  puVar2 = *(uint **)((long)JVar7.ptr + 0x30);
  iVar5 = JS_ToIndex(ctx,&local_38,argv[1]);
  if (iVar5 == 0) {
    if ((char)puVar2[1] == '\0') {
      local_60 = local_38;
      uVar6 = ~(-1 << (bVar1 & 0x1f));
      if (((uint)local_38 & uVar6) == 0) {
        uVar9 = *puVar2;
        if ((ulong)(long)(int)uVar9 < local_38) goto LAB_00131753;
        if ((int)argv[2].tag != 3) {
          val_01.tag = argv[2].tag;
          val_01.u.ptr = argv[2].u.ptr;
          iVar5 = JS_ToIndex(ctx,&local_48,val_01);
          if (iVar5 == 0) {
            if ((char)puVar2[1] == '\0') {
              p_1 = (JSRefCountHeader *)CONCAT44(local_48._4_4_,(uint)local_48);
              if (((long)p_1 << (bVar1 & 0x3f)) + local_38 <= (ulong)(long)(int)*puVar2)
              goto LAB_00131b36;
              goto LAB_00131a02;
            }
            JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
          }
          uVar10 = 0;
          JVar17 = (JSValue)(ZEXT816(6) << 0x40);
          goto LAB_00131bde;
        }
        if ((uVar9 & uVar6) == 0) {
          p_1 = (JSRefCountHeader *)((long)(int)uVar9 - local_38 >> (bVar1 & 0x3f));
LAB_00131b36:
          JVar17 = *argv;
          JVar16 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
            JVar16 = JVar17;
          }
          goto LAB_001315ac;
        }
LAB_00131a02:
        fmt = "invalid length";
      }
      else {
LAB_00131753:
        fmt = "invalid offset";
      }
      JS_ThrowRangeError(ctx,fmt);
    }
    else {
      JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
    }
  }
LAB_001314ef:
  JVar17 = (JSValue)(ZEXT816(6) << 0x40);
  uVar10 = 0;
LAB_00131bde:
  JVar19.u.ptr = (void *)((ulong)JVar17.u.ptr & 0xffffffff | uVar10);
  JVar19.tag = JVar17.tag;
  return JVar19;
}

Assistant:

static JSValue js_typed_array_constructor(JSContext *ctx,
                                          JSValueConst new_target,
                                          int argc, JSValueConst *argv,
                                          int classid)
{
    JSValue buffer, obj;
    JSArrayBuffer *abuf;
    int size_log2;
    uint64_t len, offset;

    size_log2 = typed_array_size_log2(classid);
    if (JS_VALUE_GET_TAG(argv[0]) != JS_TAG_OBJECT) {
        if (JS_ToIndex(ctx, &len, argv[0]))
            return JS_EXCEPTION;
        buffer = js_array_buffer_constructor1(ctx, JS_UNDEFINED,
                                              len << size_log2);
        if (JS_IsException(buffer))
            return JS_EXCEPTION;
        offset = 0;
    } else {
        JSObject *p = JS_VALUE_GET_OBJ(argv[0]);
        if (p->class_id == JS_CLASS_ARRAY_BUFFER ||
            p->class_id == JS_CLASS_SHARED_ARRAY_BUFFER) {
            abuf = p->u.array_buffer;
            if (JS_ToIndex(ctx, &offset, argv[1]))
                return JS_EXCEPTION;
            if (abuf->detached)
                return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
            if ((offset & ((1 << size_log2) - 1)) != 0 ||
                offset > abuf->byte_length)
                return JS_ThrowRangeError(ctx, "invalid offset");
            if (JS_IsUndefined(argv[2])) {
                if ((abuf->byte_length & ((1 << size_log2) - 1)) != 0)
                    goto invalid_length;
                len = (abuf->byte_length - offset) >> size_log2;
            } else {
                if (JS_ToIndex(ctx, &len, argv[2]))
                    return JS_EXCEPTION;
                if (abuf->detached)
                    return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
                if ((offset + (len << size_log2)) > abuf->byte_length) {
                invalid_length:
                    return JS_ThrowRangeError(ctx, "invalid length");
                }
            }
            buffer = JS_DupValue(ctx, argv[0]);
        } else {
            if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                return js_typed_array_constructor_ta(ctx, new_target, argv[0], classid);
            } else {
                return js_typed_array_constructor_obj(ctx, new_target, argv[0], classid);
            }
        }
    }

    obj = js_create_from_ctor(ctx, new_target, classid);
    if (JS_IsException(obj)) {
        JS_FreeValue(ctx, buffer);
        return JS_EXCEPTION;
    }
    if (typed_array_init(ctx, obj, buffer, offset, len)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    return obj;
}